

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall
Controller::Controller
          (Controller *this,int width,int height,int mine_count,int seed,bool only_autodiscover)

{
  Minefield local_90;
  byte local_21;
  int local_20;
  int iStack_1c;
  bool only_autodiscover_local;
  int seed_local;
  int mine_count_local;
  int height_local;
  int width_local;
  Controller *this_local;
  
  local_21 = only_autodiscover;
  local_20 = seed;
  iStack_1c = mine_count;
  seed_local = height;
  mine_count_local = width;
  _height_local = this;
  Minefield::Minefield(&this->mfield,8,8,10,0);
  this->x = 0;
  this->y = 0;
  Minefield::Minefield(&local_90,mine_count_local,seed_local,iStack_1c,local_20);
  Minefield::operator=(&this->mfield,&local_90);
  Minefield::~Minefield(&local_90);
  this->autodiscover_only = (bool)(local_21 & 1);
  return;
}

Assistant:

Controller::Controller(int width, int height, int mine_count, int seed, bool only_autodiscover) {
    x = 0;
    y = 0;

    mfield = Minefield(width, height, mine_count, seed);
    autodiscover_only = only_autodiscover;
}